

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::setIdentifier(CoreBroker *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  if ((this->super_BrokerBase).brokerState._M_i < CONNECTED) {
    std::mutex::lock((mutex *)&this->name_mutex_);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&(this->super_BrokerBase).identifier,&local_20);
    pthread_mutex_unlock((pthread_mutex_t *)&this->name_mutex_);
  }
  return;
}

Assistant:

void CoreBroker::setIdentifier(std::string_view name)
{
    if (getBrokerState() <= BrokerState::CONNECTING)  // can't be changed after initialization
    {
        const std::lock_guard<std::mutex> lock(name_mutex_);
        identifier.assign(name);
    }
}